

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::rfind(StringPiece *this,char c,size_type pos)

{
  unsigned_long *puVar1;
  unsigned_long local_38;
  unsigned_long local_30;
  stringpiece_ssize_type i;
  size_type pos_local;
  StringPiece *pSStack_18;
  char c_local;
  StringPiece *this_local;
  
  if (0 < this->length_) {
    local_38 = this->length_ - 1;
    i = pos;
    pos_local._7_1_ = c;
    pSStack_18 = this;
    puVar1 = std::min<unsigned_long>((unsigned_long *)&i,&local_38);
    for (local_30 = *puVar1; -1 < (long)local_30; local_30 = local_30 - 1) {
      if (this->ptr_[local_30] == pos_local._7_1_) {
        return local_30;
      }
    }
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::rfind(char c, size_type pos) const {
  // Note: memrchr() is not available on Windows.
  if (length_ <= 0) return npos;
  for (stringpiece_ssize_type i =
      std::min(pos, static_cast<size_type>(length_ - 1));
       i >= 0; --i) {
    if (ptr_[i] == c) {
      return i;
    }
  }
  return npos;
}